

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

int * Wlc_VecCopy(Vec_Int_t *vOut,int *pArray,int nSize)

{
  ulong uVar1;
  
  vOut->nSize = 0;
  if (0 < nSize) {
    uVar1 = 0;
    do {
      Vec_IntPush(vOut,pArray[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((uint)nSize != uVar1);
  }
  return vOut->pArray;
}

Assistant:

int * Wlc_VecCopy( Vec_Int_t * vOut, int * pArray, int nSize )
{
    int i; Vec_IntClear( vOut );
    for( i = 0; i < nSize; i++) 
        Vec_IntPush( vOut, pArray[i] );
    return Vec_IntArray( vOut );
}